

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_ASYM_PARMS_Unmarshal(TPMS_ASYM_PARMS *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = TPMT_SYM_DEF_OBJECT_Unmarshal(&target->symmetric,buffer,size,1);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPMT_ASYM_SCHEME_Unmarshal(&target->scheme,buffer,size,1);
  return TVar1;
}

Assistant:

TPM_RC
TPMS_ASYM_PARMS_Unmarshal(TPMS_ASYM_PARMS *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMT_SYM_DEF_OBJECT_Unmarshal((TPMT_SYM_DEF_OBJECT *)&(target->symmetric), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMT_ASYM_SCHEME_Unmarshal((TPMT_ASYM_SCHEME *)&(target->scheme), buffer, size, 1);
    return result;
}